

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Separator(void)

{
  uint uVar1;
  ImGuiSeparatorFlags flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    uVar1 = 1;
    if ((GImGui->CurrentWindow->DC).LayoutType == 0) {
      uVar1 = 2;
    }
    SeparatorEx(uVar1 | 4);
  }
  return;
}

Assistant:

void ImGui::Separator()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Those flags should eventually be overridable by the user
    ImGuiSeparatorFlags flags = (window->DC.LayoutType == ImGuiLayoutType_Horizontal) ? ImGuiSeparatorFlags_Vertical : ImGuiSeparatorFlags_Horizontal;
    flags |= ImGuiSeparatorFlags_SpanAllColumns; // NB: this only applies to legacy Columns() api as they relied on Separator() a lot.
    SeparatorEx(flags);
}